

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderAtomicXorCase::verify
          (ShaderAtomicXorCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ulong uVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  int in_stack_00000008;
  long in_stack_00000010;
  uint local_3c4;
  uint local_3c0;
  int local_3bc;
  Hex<8UL> local_3b0;
  MessageBuilder local_3a8;
  uint local_228;
  int local_224;
  deUint32 outputValue;
  int localNdx_1;
  Hex<8UL> local_218;
  Hex<8UL> local_210;
  Hex<8UL> local_208 [3];
  MessageBuilder local_1f0;
  uint local_70;
  int local_6c;
  deUint32 expected;
  deUint32 inputValue;
  int localNdx;
  int numXorZeros;
  deUint32 expected1;
  deUint32 expected0;
  deUint32 randomValue;
  deUint32 groupOutput;
  int groupOffset;
  int groupNdx;
  deUint32 compareMask;
  int numBits;
  int numWorkGroups;
  int workGroupSize;
  void *outputs_local;
  size_t sStack_28;
  int outputStride_local;
  void *inputs_local;
  int inputStride_local;
  int numValues_local;
  ShaderAtomicXorCase *this_local;
  
  outputs_local._4_4_ = (int)tbs;
  inputs_local._4_4_ = (int)ctx;
  inputs_local._0_4_ = (int)sig;
  _numWorkGroups = tbslen;
  sStack_28 = siglen;
  _inputStride_local = this;
  numBits = product<unsigned_int,3>(&(this->super_ShaderAtomicOpCase).m_workGroupSize);
  compareMask = inputs_local._4_4_ / numBits;
  if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_HIGHP) {
    local_3bc = 0x20;
  }
  else {
    local_3bc = 8;
    if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_MEDIUMP) {
      local_3bc = 0x10;
    }
  }
  groupNdx = local_3bc;
  if (local_3bc == 0x20) {
    local_3c0 = 0xffffffff;
  }
  else {
    local_3c0 = (1 << ((byte)local_3bc & 0x1f)) - 1;
  }
  groupOffset = local_3c0;
  groupOutput = 0;
  do {
    uVar1 = (ulong)groupOutput;
    if ((int)compareMask <= (int)groupOutput) {
      this_local._7_1_ = 1;
LAB_020f9139:
      return (int)CONCAT71((int7)(uVar1 >> 8),this_local._7_1_);
    }
    randomValue = groupOutput * numBits;
    expected0 = *(uint *)(in_stack_00000010 + (int)(groupOutput * in_stack_00000008));
    numXorZeros = *(uint *)(sStack_28 + (long)(int)((int)inputs_local * randomValue));
    localNdx = numXorZeros ^ 0xffffffff;
    inputValue = (deUint32)((this->super_ShaderAtomicOpCase).m_initialValue == 0);
    for (expected = 1; (int)expected < numBits; expected = expected + 1) {
      local_6c = *(int *)(sStack_28 + (long)(int)((int)inputs_local * (randomValue + expected)));
      if (local_6c == 0) {
        inputValue = inputValue + 1;
      }
    }
    local_3c4 = localNdx;
    if ((int)inputValue % 2 == 0) {
      local_3c4 = numXorZeros;
    }
    local_70 = local_3c4;
    expected1 = numXorZeros;
    if ((expected0 & local_3c0) != (local_3c4 & local_3c0)) {
      pTVar2 = tcu::TestContext::getLog
                         ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1f0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_1f0,(char (*) [17])"ERROR: at group ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)&groupOutput);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2b883c4);
      local_208[0] = tcu::toHex<unsigned_int>(numXorZeros);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_208);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])" or ");
      local_210 = tcu::toHex<unsigned_int>(localNdx);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_210);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])" (compare mask ");
      local_218 = tcu::toHex<unsigned_int>(groupOffset);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_218);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0x2c2dd70);
      _outputValue = tcu::toHex<unsigned_int>(expected0);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(Hex<8UL> *)&outputValue);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1f0);
      this_local._7_1_ = 0;
      uVar1 = extraout_RAX;
      goto LAB_020f9139;
    }
    for (local_224 = 0; local_224 < numBits; local_224 = local_224 + 1) {
      local_228 = *(uint *)(_numWorkGroups +
                           (long)(int)(outputs_local._4_4_ * (randomValue + local_224)));
      if (((((local_228 & local_3c0) != 0) && ((local_228 & local_3c0) != local_3c0)) &&
          ((local_228 & local_3c0) != (numXorZeros & local_3c0))) &&
         ((local_228 & local_3c0) != (localNdx & local_3c0))) {
        pTVar2 = tcu::TestContext::getLog
                           ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_3a8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar3 = tcu::MessageBuilder::operator<<(&local_3a8,(char (*) [17])"ERROR: at group ");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)&groupOutput);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])", invocation ");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_224);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [26])": found unexpected value ");
        local_3b0 = tcu::toHex<unsigned_int>(local_228);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_3b0);
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3a8);
        this_local._7_1_ = 0;
        uVar1 = extraout_RAX_00;
        goto LAB_020f9139;
      }
    }
    groupOutput = groupOutput + 1;
  } while( true );
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	compareMask		= numBits == 32 ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			const deUint32	randomValue		= *(const deInt32*)((const deUint8*)inputs + inputStride*groupOffset);
			const deUint32	expected0		= randomValue ^ 0u;
			const deUint32	expected1		= randomValue ^ ~0u;
			int				numXorZeros		= (m_initialValue == 0) ? 1 : 0;

			for (int localNdx = 1; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 inputValue = *(const deUint32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				if (inputValue == 0)
					numXorZeros += 1;
			}

			const deUint32 expected = (numXorZeros%2 == 0) ? expected0 : expected1;

			if ((groupOutput & compareMask) != (expected & compareMask))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected " << tcu::toHex(expected0)
													   << " or " << tcu::toHex(expected1) << " (compare mask " << tcu::toHex(compareMask)
													   << "), got " << tcu::toHex(groupOutput) << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if ((outputValue & compareMask) != 0 &&
					(outputValue & compareMask) != compareMask &&
					(outputValue & compareMask) != (expected0&compareMask) &&
					(outputValue & compareMask) != (expected1&compareMask))
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << tcu::toHex(outputValue)
									   << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}